

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

CharFormat testing::internal::PrintAsStringLiteralTo(char32_t c,ostream *os)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  ostream *this;
  char *pcVar4;
  
  switch(c) {
  case L'\0':
    pcVar4 = "\\0";
    break;
  case L'\x01':
  case L'\x02':
  case L'\x03':
  case L'\x04':
  case L'\x05':
  case L'\x06':
switchD_003ac21d_caseD_1:
    if ((uint)(c + L'\xffffffe0') < 0x5f) {
      std::operator<<(os,(char)c);
      return kAsIs;
    }
    uVar1 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
    this = std::operator<<(os,"\\x");
    lVar2 = *(long *)this;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(this + lVar3 + 0x18) = *(uint *)(this + lVar3 + 0x18) & 0xffffffb5 | 8;
    *(uint *)(this + *(long *)(lVar2 + -0x18) + 0x18) =
         *(uint *)(this + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
    std::ostream::operator<<(this,c);
    *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar1;
    return kHexEscape;
  case L'\a':
    pcVar4 = "\\a";
    break;
  case L'\b':
    pcVar4 = "\\b";
    break;
  case L'\t':
    pcVar4 = "\\t";
    break;
  case L'\n':
    pcVar4 = "\\n";
    break;
  case L'\v':
    pcVar4 = "\\v";
    break;
  case L'\f':
    pcVar4 = "\\f";
    break;
  case L'\r':
    pcVar4 = "\\r";
    break;
  default:
    if (c == L'\"') {
      pcVar4 = "\\\"";
    }
    else {
      if (c != L'\\') {
        if (c == L'\'') {
          std::operator<<(os,"\'");
          return kAsIs;
        }
        goto switchD_003ac21d_caseD_1;
      }
      pcVar4 = "\\\\";
    }
  }
  std::operator<<(os,pcVar4);
  return kSpecialEscape;
}

Assistant:

static CharFormat PrintAsStringLiteralTo(char32_t c, ostream* os) {
  switch (c) {
    case L'\'':
      *os << "'";
      return kAsIs;
    case L'"':
      *os << "\\\"";
      return kSpecialEscape;
    default:
      return PrintAsCharLiteralTo(c, os);
  }
}